

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmprocdemo.c
# Opt level: O2

int main(void)

{
  void *pvVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  uint8_t local_21;
  size_t len;
  uint rate;
  
  rate = 48000;
  snd_pcm_open(&device,"default",0,0);
  snd_pcm_hw_params_malloc(&params);
  snd_pcm_hw_params_any(device,params);
  snd_pcm_hw_params_set_access(device,params,3);
  snd_pcm_hw_params_set_format(device,params,0xe);
  snd_pcm_hw_params_set_channels(device,params,2);
  snd_pcm_hw_params_set_rate_near(device,params,&rate,0);
  snd_pcm_hw_params(device,params);
  xm_create_context_from_libxmize(&ctx,mus,rate);
  iVar3 = 1;
  pvVar1 = xm_get_sample_waveform(ctx,1,0,&len,&local_21);
  for (uVar2 = 0x40; uVar2 < len; uVar2 = uVar2 + 1) {
    *(undefined1 *)((long)pvVar1 + uVar2) = 0x7f;
  }
  uVar4 = 0;
  pvVar1 = xm_get_sample_waveform(ctx,2,0,&len,&local_21);
  for (uVar2 = 0; uVar2 < len; uVar2 = uVar2 + 1) {
    *(char *)((long)pvVar1 + uVar2) = (char)(uVar4 / len) + -0x80;
    uVar4 = uVar4 + 0x100;
  }
  pvVar1 = xm_get_sample_waveform(ctx,4,0,&len,&local_21);
  for (lVar5 = 0; lVar5 != 0x80; lVar5 = lVar5 + 1) {
    *(undefined1 *)((long)pvVar1 + lVar5) = 0x80;
  }
  for (lVar5 = 0; lVar5 != 0x30; lVar5 = lVar5 + 1) {
    *(undefined1 *)((long)pvVar1 + lVar5 + 0x80) = 0x7f;
  }
  for (uVar2 = 0xb0; uVar2 < len; uVar2 = uVar2 + 1) {
    *(undefined1 *)((long)pvVar1 + uVar2) = 0x80;
  }
  pvVar1 = xm_get_sample_waveform(ctx,8,0,&len,&local_21);
  for (uVar2 = 0; uVar2 < len; uVar2 = uVar2 + 1) {
    iVar3 = iVar3 * 0x1fbf + 1;
    *(char *)((long)pvVar1 + uVar2) = (char)((uint)iVar3 >> 0x10);
  }
  snd_pcm_prepare(device);
  do {
    xm_generate_samples(ctx,buffer,0x800);
    snd_pcm_writei(device,buffer,0x800);
  } while( true );
}

Assistant:

int main(void) {
	unsigned int rate = 48000;

	snd_pcm_open(&device, "default", SND_PCM_STREAM_PLAYBACK, 0);
	snd_pcm_hw_params_malloc(&params);
	snd_pcm_hw_params_any(device, params);
	snd_pcm_hw_params_set_access(device, params, SND_PCM_ACCESS_RW_INTERLEAVED);
	snd_pcm_hw_params_set_format(device, params, SND_PCM_FORMAT_FLOAT);
	snd_pcm_hw_params_set_channels(device, params, 2);
	snd_pcm_hw_params_set_rate_near(device, params, &rate, NULL);
	snd_pcm_hw_params(device, params);

	xm_create_context_from_libxmize(&ctx, mus, rate);
	gen_waveforms();

	snd_pcm_prepare(device);

	while(1) {
		xm_generate_samples(ctx, buffer, 2048);
		snd_pcm_writei(device, buffer, 2048);
	}

	return 0;
}